

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

UnqualifiedName * __thiscall soul::StructuralParser::parseUnqualifiedName(StructuralParser *this)

{
  bool bVar1;
  UnqualifiedName *pUVar2;
  Identifier identifier;
  Context context;
  Identifier local_60;
  Context local_58;
  CompileMessage local_40;
  
  getContext(&local_58,this);
  local_60 = parseIdentifierWithMaxLength(this,0x80);
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)0x275273);
  if (bVar1) {
    Errors::identifierMustBeUnqualified<>();
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_40);
    CompileMessage::~CompileMessage(&local_40);
  }
  pUVar2 = allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier&>
                     (this,&local_58,&local_60);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_58);
  return pUVar2;
}

Assistant:

AST::UnqualifiedName& parseUnqualifiedName()
    {
        auto context = getContext();
        auto identifier = parseIdentifierWithMaxLength (AST::maxIdentifierLength);

        if (matches (Operator::doubleColon))
            throwError (Errors::identifierMustBeUnqualified());

        return allocate<AST::UnqualifiedName> (context, identifier);
    }